

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O1

int __thiscall
CVmImageLoader::restore_synth_exports(CVmImageLoader *this,CVmFile *fp,CVmObjFixup *fixups)

{
  CVmHashTable *this_00;
  long lVar1;
  CVmHashEntry *this_01;
  size_t buflen;
  size_t len;
  ulong uVar2;
  char b_1 [2];
  char dh [5];
  vm_val_t val;
  char b [4];
  ushort local_160;
  char local_15d [5];
  CVmImageLoader *local_158;
  CVmObjFixup *local_150;
  vm_val_t local_148;
  uint local_138 [66];
  
  local_158 = this;
  local_150 = fixups;
  CVmHashTable::delete_all_entries(G_image_loader_X->synth_exports_);
  CVmFile::read_bytes(fp,(char *)local_138,4);
  uVar2 = (ulong)local_138[0];
  if (uVar2 != 0) {
    do {
      CVmFile::read_bytes(fp,(char *)&local_160,2);
      len = (size_t)local_160;
      buflen = 0x100;
      if (local_160 < 0x100) {
        buflen = (size_t)(uint)local_160;
      }
      CVmFile::read_bytes(fp,(char *)local_138,buflen);
      if (0x100 < len) {
        lVar1 = ftell((FILE *)fp->fp_);
        fseek((FILE *)fp->fp_,len + lVar1 + -0x100,0);
        len = 0x100;
      }
      CVmFile::read_bytes(fp,local_15d,5);
      CVmObjFixup::fix_dh(local_150,local_15d);
      local_148.typ = (vm_datatype_t)local_15d[0];
      vmb_get_dh_val(local_15d,&local_148);
      this_00 = local_158->synth_exports_;
      this_01 = (CVmHashEntry *)operator_new(0x38);
      CVmHashEntry::CVmHashEntry(this_01,(char *)local_138,len,1);
      this_01->_vptr_CVmHashEntry = (_func_int **)&PTR__CVmHashEntry_0036e648;
      this_01[1]._vptr_CVmHashEntry = (_func_int **)CONCAT44(local_148._4_4_,local_148.typ);
      this_01[1].nxt_ = (CVmHashEntry *)local_148.val;
      CVmHashTable::add(this_00,this_01);
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  return 0;
}

Assistant:

int CVmImageLoader::restore_synth_exports(VMG_ CVmFile *fp,
                                          CVmObjFixup *fixups)
{
    long cnt;
    
    /* 
     *   discard the old synthesized exports - we want to entirely replace
     *   these with what we're about to load from the file 
     */
    G_image_loader->discard_synth_exports();

    /* read the number of synthesized exports */
    cnt = fp->read_uint4();

    /* read the exports */
    for ( ; cnt != 0 ; --cnt)
    {
        size_t len;
        char buf[256];
        char dh[VMB_DATAHOLDER];
        vm_val_t val;
        
        /* read the length of the name and the name */
        len = fp->read_uint2();
        fp->read_bytes(buf, len > sizeof(buf) ? sizeof(buf) : len);

        /* skip any part of the name that didn't fit in the buffer */
        if (len > sizeof(buf))
        {
            /* skip the extra bytes */
            fp->set_pos(fp->get_pos() + (len - sizeof(buf)));

            /* limit the length we use to the buffer size */
            len = sizeof(buf);
        }

        /* read the value */
        fp->read_bytes(dh, VMB_DATAHOLDER);

        /* if the value is an object reference, fix it up */
        fixups->fix_dh(vmg_ dh);

        /* get the value */
        vmb_get_dh(dh, &val);

        /* add the export */
        synth_exports_->add(new CVmHashEntryExport(buf, len, TRUE, &val));
    }

    /* success */
    return 0;
}